

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMMemTest.cpp
# Opt level: O0

int main(void)

{
  int local_10;
  int local_c;
  int i;
  
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    mymain();
  }
  if ((errorOccurred & 1U) == 0) {
    printf("Test Run Successfully\n");
    local_c = 0;
  }
  else {
    printf("Test Failed\n");
    local_c = 4;
  }
  return local_c;
}

Assistant:

int  main() {
   for (int i = 0; i<3; i++)
        mymain();

    if (errorOccurred) {
        printf("Test Failed\n");
        return 4;
    }

    printf("Test Run Successfully\n");

    return 0;
}